

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O3

void __thiscall
sc_core::sc_clock::sc_clock
          (sc_clock *this,void **vtt,char *name_,double period_v_,sc_time_unit period_tu_,
          double duty_cycle_)

{
  sc_event *psVar1;
  sc_signal_in_if<bool> sVar2;
  sc_simcontext *psVar3;
  iterator __position;
  value_type vVar4;
  value_type vVar5;
  notify_t nVar6;
  sc_event_timed *elem;
  pointer ppsVar7;
  sc_time local_48;
  double local_40;
  double local_38;
  
  local_48.m_value = local_48.m_value & 0xffffffffffffff00;
  local_40 = duty_cycle_;
  local_38 = period_v_;
  sc_signal_t<bool,_(sc_core::sc_writer_policy)0>::sc_signal_t
            ((sc_signal_t<bool,_(sc_core::sc_writer_policy)0> *)this,vtt + 2,name_,(bool *)&local_48
            );
  sVar2 = *(sc_signal_in_if<bool> *)(vtt + 1);
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_in_if<bool> = sVar2;
  *(void **)(&(this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
              super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
              super_sc_signal_in_if<bool>.field_0x0 + *(long *)((long)sVar2 + -0x30)) = vtt[0xc];
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_write_if<bool> = *(sc_signal_write_if<bool> *)(vtt + 0xd);
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
  super_sc_prim_channel.super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00265c30;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).m_negedge_event_p = (sc_event *)0x0;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).m_posedge_event_p = (sc_event *)0x0;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).m_reset_p = (sc_reset *)0x0;
  sVar2 = (sc_signal_in_if<bool>)*vtt;
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_in_if<bool> = sVar2;
  *(void **)(&(this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
              super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
              super_sc_signal_in_if<bool>.field_0x0 + *(long *)((long)sVar2 + -0x30)) = vtt[0xe];
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_write_if<bool> = *(sc_signal_write_if<bool> *)(vtt + 0xf);
  (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
  super_sc_prim_channel.super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00265470;
  psVar1 = &this->m_next_posedge_event;
  (this->m_period).m_value = 0;
  this->m_duty_cycle = 0.0;
  *(undefined8 *)((long)&this->m_duty_cycle + 1) = 0;
  *(undefined8 *)((long)&(this->m_start_time).m_value + 1) = 0;
  (this->m_posedge_time).m_value = 0;
  (this->m_negedge_time).m_value = 0;
  sc_event::sc_event(psVar1,"next_posedge_event");
  sc_event::sc_event(&this->m_next_negedge_event,"next_negedge_event");
  sc_time::sc_time(&local_48,local_38,period_tu_,
                   (this->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
                   super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
                   super_sc_prim_channel.super_sc_object.m_simc);
  init(this,(EVP_PKEY_CTX *)&local_48);
  if ((this->m_start_time).m_value == SC_ZERO_TIME) {
    psVar3 = (this->m_next_posedge_event).m_simc;
    __position._M_current =
         (psVar3->m_delta_events).
         super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar3->m_delta_events).
        super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_48.m_value = (value_type)psVar1;
      std::vector<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>::_M_realloc_insert
                (&psVar3->m_delta_events,__position,(value_type *)&local_48);
      ppsVar7 = (psVar3->m_delta_events).
                super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = psVar1;
      ppsVar7 = (psVar3->m_delta_events).
                super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + 1;
      (psVar3->m_delta_events).
      super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppsVar7;
    }
    (this->m_next_posedge_event).m_delta_event_index =
         (int)((ulong)((long)ppsVar7 -
                      (long)(psVar3->m_delta_events).
                            super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    nVar6 = DELTA;
  }
  else {
    elem = (sc_event_timed *)sc_event_timed::allocate();
    vVar4 = (this->m_start_time).m_value;
    psVar3 = (this->m_next_posedge_event).m_simc;
    vVar5 = (psVar3->m_curr_time).m_value;
    elem->m_event = psVar1;
    (elem->m_notify_time).m_value = vVar4 + vVar5;
    sc_ppq_base::insert(&psVar3->m_timed_events->super_sc_ppq_base,elem);
    (this->m_next_posedge_event).m_timed = elem;
    nVar6 = TIMED;
  }
  (this->m_next_posedge_event).m_notify_type = nVar6;
  return;
}

Assistant:

sc_clock::sc_clock( const char* name_,
		    double         period_v_,
		    sc_time_unit   period_tu_,
		    double         duty_cycle_ ) :
    base_type( name_ ),
    m_period(), m_duty_cycle(), m_start_time(), m_posedge_first(),
    m_posedge_time(), m_negedge_time(),
    m_next_posedge_event( sc_event::kernel_event, "next_posedge_event" ),
    m_next_negedge_event( sc_event::kernel_event, "next_negedge_event" )
{
    init( sc_time( period_v_, period_tu_, simcontext() ),
	  duty_cycle_,
	  SC_ZERO_TIME,
	  true );

    // posedge first
    m_next_posedge_event.notify_internal( m_start_time );
}